

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzd_additional.c
# Opt level: O1

void mzd_addmul_v_s128_30_128(mzd_local_t *c,mzd_local_t *v,mzd_local_t *A)

{
  long lVar1;
  block_t *Ablock;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  auVar2 = vpbroadcastq_avx512vl();
  auVar5 = vpsllq_avx(auVar2,0x1d);
  auVar5 = vpsraq_avx512vl(auVar5,0x3f);
  auVar5 = vpternlogq_avx512vl(auVar5,*(undefined1 (*) [16])c->w64,*(undefined1 (*) [16])A->w64,0x6c
                              );
  auVar2 = vpsllq_avx(auVar2,0x1c);
  auVar2 = vpsraq_avx512vl(auVar2,0x3f);
  auVar2 = vpand_avx(auVar2,*(undefined1 (*) [16])(A->w64 + 2));
  lVar1 = 0x20;
  do {
    auVar3 = vpbroadcastq_avx512vl();
    auVar4 = vpbroadcastq_avx512vl();
    auVar6 = vpsllq_avx(auVar4,0x3e);
    auVar6 = vpsraq_avx512vl(auVar6,0x3f);
    auVar7 = vpsllq_avx(auVar4,0x3d);
    auVar7 = vpsraq_avx512vl(auVar7,0x3f);
    auVar5 = vpternlogq_avx512vl(auVar5,auVar3,*(undefined1 (*) [16])((long)A->w64 + lVar1),0x78);
    auVar5 = vpternlogq_avx512vl(auVar5,auVar7,*(undefined1 (*) [16])((long)A[1].w64 + lVar1),0x78);
    auVar3 = vpsllq_avx(auVar4,0x3c);
    auVar3 = vpsraq_avx512vl(auVar3,0x3f);
    auVar2 = vpternlogq_avx512vl(auVar2,auVar6,*(undefined1 (*) [16])((long)A->w64 + lVar1 + 0x10),
                                 0x78);
    auVar2 = vpternlogq_avx512vl(auVar2,auVar3,*(undefined1 (*) [16])((long)A[1].w64 + lVar1 + 0x10)
                                 ,0x78);
    lVar1 = lVar1 + 0x40;
  } while ((int)lVar1 != 0x1e0);
  *(undefined1 (*) [16])c->w64 = auVar5 ^ auVar2;
  return;
}

Assistant:

ATTR_TARGET_S128
void mzd_addmul_v_s128_30_128(mzd_local_t* c, mzd_local_t const* v, mzd_local_t const* A) {
  block_t* cblock       = BLOCK(c, 0);
  const block_t* Ablock = CONST_BLOCK(A, 0);
  word idx              = CONST_BLOCK(v, 0)->w64[1] >> 34;

  word128 cval[2];
  cval[0] = mm128_xor_mask(mm128_load(cblock->w64), mm128_load(&Ablock[0].w64[0]),
                           mm128_compute_mask(idx, 0));
  cval[1] = mm128_and(mm128_load(&Ablock[0].w64[2]), mm128_compute_mask(idx, 1));
  idx >>= 2;
  Ablock += 1;

  for (unsigned int i = 28; i; i -= 4, idx >>= 4, Ablock += 2) {
    cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[0].w64[0]), mm128_compute_mask(idx, 0));
    cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[0].w64[2]), mm128_compute_mask(idx, 1));
    cval[0] = mm128_xor_mask(cval[0], mm128_load(&Ablock[1].w64[0]), mm128_compute_mask(idx, 2));
    cval[1] = mm128_xor_mask(cval[1], mm128_load(&Ablock[1].w64[2]), mm128_compute_mask(idx, 3));
  }
  mm128_store(cblock->w64, mm128_xor(cval[0], cval[1]));
}